

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.cpp
# Opt level: O2

void __thiscall
phaeton::ExpressionNode::ExpressionNode
          (ExpressionNode *this,ExprKind Kind,int NumChildren,ExprDims *ED)

{
  int I;
  int iVar1;
  ExpressionNode *local_30;
  
  this->_vptr_ExpressionNode = (_func_int **)&PTR__ExpressionNode_0015f5e8;
  this->ExKind = Kind;
  this->NumChildren = NumChildren;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->Dims,ED);
  for (iVar1 = 0; iVar1 < this->NumChildren; iVar1 = iVar1 + 1) {
    local_30 = (ExpressionNode *)0x0;
    std::vector<phaeton::ExpressionNode*,std::allocator<phaeton::ExpressionNode*>>::
    emplace_back<phaeton::ExpressionNode*>
              ((vector<phaeton::ExpressionNode*,std::allocator<phaeton::ExpressionNode*>> *)
               &this->Children,&local_30);
  }
  return;
}

Assistant:

ExpressionNode::ExpressionNode(ExprKind Kind, int NumChildren,
                               const ExprDims &ED)
    : ExKind(Kind), NumChildren(NumChildren), Dims(ED) {
  for (int I = 0; I < getNumChildren(); ++I) {
    Children.push_back(nullptr);
  }
}